

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QList<QtGraphicsAnchorLayout::AnchorData_*> * __thiscall
QSet<QtGraphicsAnchorLayout::AnchorData_*>::values(QSet<QtGraphicsAnchorLayout::AnchorData_*> *this)

{
  long lVar1;
  bool bVar2;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *in_RSI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *result;
  const_iterator i;
  parameter_type this_00;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->_vptr_AnchorData)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->super_QSimplexVariable).result = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QSimplexVariable).index = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QtGraphicsAnchorLayout::AnchorData_*>::QList
            ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)0x946a60);
  size((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x946a6a);
  QList<QtGraphicsAnchorLayout::AnchorData_*>::reserve(in_stack_ffffffffffffffd8,in_stack_00000018);
  constBegin(in_RSI);
  while( true ) {
    constEnd(in_RSI);
    bVar2 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI);
    if (!bVar2) break;
    const_iterator::operator*((const_iterator *)0x946acc);
    QList<QtGraphicsAnchorLayout::AnchorData_*>::append
              ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)0x946ad9,in_RDI);
    const_iterator::operator++((const_iterator *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI;
}

Assistant:

Q_OUTOFLINE_TEMPLATE QList<T> QSet<T>::values() const
{
    QList<T> result;
    result.reserve(size());
    typename QSet<T>::const_iterator i = constBegin();
    while (i != constEnd()) {
        result.append(*i);
        ++i;
    }
    return result;
}